

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_surjectionproof_generate
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,
              secp256k1_generator *ephemeral_input_tags,size_t n_ephemeral_input_tags,
              secp256k1_generator *ephemeral_output_tag,size_t input_index,uchar *input_blinding_key
              ,uchar *output_blinding_key)

{
  secp256k1_surjectionproof *psVar1;
  int iVar2;
  ulong uVar3;
  uchar *bin;
  uint uVar4;
  secp256k1_gej *r;
  long lVar5;
  ulong uVar6;
  secp256k1_generator *a;
  ulong uVar7;
  secp256k1_sha256 *hash;
  secp256k1_scalar *s;
  int overflow;
  int local_a18c;
  long local_a188;
  secp256k1_generator *local_a180;
  secp256k1_surjectionproof *local_a178;
  secp256k1_context *local_a170;
  uchar *local_a168;
  size_t local_a160;
  long local_a158;
  size_t local_a150;
  size_t indices [1];
  size_t rsizes [1];
  secp256k1_scalar blinding_key;
  secp256k1_scalar tmps;
  uchar sec_input [36];
  secp256k1_scalar nonce;
  uchar msg32 [32];
  secp256k1_scalar borromean_s [256];
  secp256k1_gej ring_pubkeys [256];
  
  overflow = 0;
  local_a150 = input_index;
  if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    secp256k1_surjectionproof_generate_cold_7();
  }
  else if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_surjectionproof_generate_cold_6();
  }
  else if (proof == (secp256k1_surjectionproof *)0x0) {
    secp256k1_surjectionproof_generate_cold_5();
  }
  else if (ephemeral_input_tags == (secp256k1_generator *)0x0) {
    secp256k1_surjectionproof_generate_cold_4();
  }
  else if (ephemeral_output_tag == (secp256k1_generator *)0x0) {
    secp256k1_surjectionproof_generate_cold_3();
  }
  else if (input_blinding_key == (uchar *)0x0) {
    secp256k1_surjectionproof_generate_cold_2();
  }
  else {
    if (output_blinding_key != (uchar *)0x0) {
      local_a180 = ephemeral_output_tag;
      local_a178 = proof;
      secp256k1_scalar_set_b32(&tmps,input_blinding_key,&overflow);
      if (overflow != 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&blinding_key,output_blinding_key,&overflow);
      psVar1 = local_a178;
      if (overflow != 0) {
        return 0;
      }
      if ((((tmps.d[0] == blinding_key.d[0]) && (tmps.d[1] == blinding_key.d[1])) &&
          (tmps.d[2] == blinding_key.d[2])) &&
         ((tmps.d[3] == blinding_key.d[3] &&
          (((tmps.d[1] != 0 || tmps.d[0] != 0) || tmps.d[2] != 0) || tmps.d[3] != 0)))) {
        return 0;
      }
      local_a170 = ctx;
      secp256k1_scalar_negate(&tmps,&tmps);
      secp256k1_scalar_add(&blinding_key,&blinding_key,&tmps);
      uVar7 = psVar1->n_inputs;
      if (uVar7 + 7 < 8) {
        uVar6 = 0;
      }
      else {
        uVar3 = 0;
        uVar6 = 0;
        do {
          uVar6 = uVar6 + (((uint)psVar1->used_inputs[uVar3] * 0x8040201 >> 3 & 0x11111111) *
                           0x11111111 >> 0x1c);
          uVar3 = uVar3 + 1;
        } while (uVar7 + 7 >> 3 != uVar3);
      }
      if (uVar7 == n_ephemeral_input_tags) {
        if (uVar7 < uVar6) {
          return 0;
        }
        if (n_ephemeral_input_tags == 0) {
          local_a188 = 0;
        }
        else {
          local_a168 = local_a180->data + 0x20;
          local_a188 = 0;
          lVar5 = 0;
          uVar7 = 0;
          a = ephemeral_input_tags;
          local_a160 = n_ephemeral_input_tags;
          do {
            if ((local_a178->used_inputs[uVar7 >> 3] >> ((uint)uVar7 & 7) & 1) != 0) {
              secp256k1_fe_set_b32((secp256k1_fe *)borromean_s,a->data);
              secp256k1_fe_set_b32((secp256k1_fe *)(borromean_s[1].d + 1),a->data + 0x20);
              borromean_s[2].d[2]._0_4_ = 0;
              secp256k1_ge_neg((secp256k1_ge *)borromean_s,(secp256k1_ge *)borromean_s);
              r = ring_pubkeys + lVar5;
              ring_pubkeys[lVar5].infinity = (int)borromean_s[2].d[2];
              (r->x).n[0] = borromean_s[0].d[0];
              ring_pubkeys[lVar5].x.n[1] = borromean_s[0].d[1];
              ring_pubkeys[lVar5].x.n[2] = borromean_s[0].d[2];
              ring_pubkeys[lVar5].x.n[3] = borromean_s[0].d[3];
              ring_pubkeys[lVar5].x.n[4] = borromean_s[1].d[0];
              ring_pubkeys[lVar5].y.n[0] = borromean_s[1].d[1];
              ring_pubkeys[lVar5].y.n[1] = borromean_s[1].d[2];
              ring_pubkeys[lVar5].y.n[2] = borromean_s[1].d[3];
              ring_pubkeys[lVar5].y.n[3] = borromean_s[2].d[0];
              ring_pubkeys[lVar5].y.n[4] = borromean_s[2].d[1];
              ring_pubkeys[lVar5].z.n[0] = 1;
              ring_pubkeys[lVar5].z.n[3] = 0;
              ring_pubkeys[lVar5].z.n[4] = 0;
              ring_pubkeys[lVar5].z.n[1] = 0;
              ring_pubkeys[lVar5].z.n[2] = 0;
              local_a158 = lVar5;
              secp256k1_fe_set_b32((secp256k1_fe *)borromean_s,local_a180->data);
              n_ephemeral_input_tags = local_a160;
              secp256k1_fe_set_b32((secp256k1_fe *)(borromean_s[1].d + 1),local_a168);
              lVar5 = local_a158;
              borromean_s[2].d[2]._0_4_ = 0;
              secp256k1_gej_add_ge_var(r,r,(secp256k1_ge *)borromean_s,(secp256k1_fe *)0x0);
              if (local_a150 == uVar7) {
                local_a188 = lVar5;
              }
              lVar5 = lVar5 + 1;
            }
            uVar7 = uVar7 + 1;
            a = a + 1;
          } while (n_ephemeral_input_tags != uVar7);
        }
        rsizes[0] = (size_t)(int)uVar6;
        indices[0] = (size_t)(int)local_a188;
        borromean_s[0].d[0] = 0xbb67ae856a09e667;
        borromean_s[0].d[1] = 0xa54ff53a3c6ef372;
        borromean_s[0].d[2] = 0x9b05688c510e527f;
        borromean_s[0].d[3] = 0x5be0cd191f83d9ab;
        borromean_s[3].d[0] = 0;
        if (n_ephemeral_input_tags != 0) {
          do {
            nonce.d[0]._0_1_ = ephemeral_input_tags->data[0x3f] & 1 | 2;
            nonce.d[2]._1_7_ = (undefined7)*(undefined8 *)(ephemeral_input_tags->data + 0x10);
            nonce.d[3]._0_1_ =
                 (undefined1)((ulong)*(undefined8 *)(ephemeral_input_tags->data + 0x10) >> 0x38);
            nonce.d[3]._1_7_ = (undefined7)*(undefined8 *)(ephemeral_input_tags->data + 0x18);
            nonce.d[0]._1_7_ = (undefined7)*(undefined8 *)ephemeral_input_tags->data;
            nonce.d[1]._0_1_ =
                 (undefined1)((ulong)*(undefined8 *)ephemeral_input_tags->data >> 0x38);
            nonce.d[1]._1_7_ = (undefined7)*(undefined8 *)(ephemeral_input_tags->data + 8);
            nonce.d[2]._0_1_ =
                 (undefined1)((ulong)*(undefined8 *)(ephemeral_input_tags->data + 8) >> 0x38);
            secp256k1_sha256_write((secp256k1_sha256 *)borromean_s,(uchar *)&nonce,0x21);
            ephemeral_input_tags = ephemeral_input_tags + 1;
            n_ephemeral_input_tags = n_ephemeral_input_tags - 1;
          } while (n_ephemeral_input_tags != 0);
        }
        nonce.d[0]._0_1_ = local_a180->data[0x3f] & 1 | 2;
        nonce.d[0]._1_7_ = (undefined7)*(undefined8 *)local_a180->data;
        nonce.d[1]._0_1_ = (undefined1)((ulong)*(undefined8 *)local_a180->data >> 0x38);
        nonce.d[1]._1_7_ = (undefined7)*(undefined8 *)(local_a180->data + 8);
        nonce.d[2]._0_1_ = (undefined1)((ulong)*(undefined8 *)(local_a180->data + 8) >> 0x38);
        nonce.d[2]._1_7_ = (undefined7)*(undefined8 *)(local_a180->data + 0x10);
        nonce.d[3]._0_1_ = (undefined1)((ulong)*(undefined8 *)(local_a180->data + 0x10) >> 0x38);
        nonce.d[3]._1_7_ = (undefined7)*(undefined8 *)(local_a180->data + 0x18);
        hash = (secp256k1_sha256 *)borromean_s;
        secp256k1_sha256_write(hash,(uchar *)&nonce,0x21);
        secp256k1_sha256_finalize(hash,msg32);
        secp256k1_scalar_get_b32(sec_input + 4,&blinding_key);
        if (uVar6 != 0) {
          uVar7 = 0;
          do {
            local_a18c = 0;
            sec_input[0] = (uchar)uVar7;
            sec_input[1] = (uchar)(uVar7 >> 8);
            sec_input[2] = (uchar)(uVar7 >> 0x10);
            sec_input[3] = (uchar)(uVar7 >> 0x18);
            nonce.d[0]._0_1_ = 0x67;
            nonce.d[0]._1_7_ = 0xbb67ae856a09e6;
            nonce.d[1]._0_1_ = 0x72;
            nonce.d[1]._1_7_ = 0xa54ff53a3c6ef3;
            nonce.d[2]._0_1_ = 0x7f;
            nonce.d[2]._1_7_ = 0x9b05688c510e52;
            nonce.d[3]._0_1_ = 0xab;
            nonce.d[3]._1_7_ = 0x5be0cd191f83d9;
            secp256k1_sha256_write((secp256k1_sha256 *)&nonce,sec_input,0x24);
            secp256k1_sha256_finalize((secp256k1_sha256 *)&nonce,sec_input);
            secp256k1_scalar_set_b32((secp256k1_scalar *)hash,sec_input,&local_a18c);
            if (local_a18c == 1) {
              return 0;
            }
            uVar7 = uVar7 + 1;
            hash = (secp256k1_sha256 *)hash->buf;
          } while (uVar6 != uVar7);
        }
        psVar1 = local_a178;
        nonce.d[0]._0_1_ = (byte)borromean_s[local_a188].d[0];
        nonce.d[0]._1_7_ = (undefined7)(borromean_s[local_a188].d[0] >> 8);
        nonce.d[1]._0_1_ = (undefined1)borromean_s[local_a188].d[1];
        nonce.d[1]._1_7_ = (undefined7)(borromean_s[local_a188].d[1] >> 8);
        nonce.d[2]._0_1_ = (undefined1)borromean_s[local_a188].d[2];
        nonce.d[2]._1_7_ = (undefined7)(borromean_s[local_a188].d[2] >> 8);
        nonce.d[3]._0_1_ = (undefined1)borromean_s[local_a188].d[3];
        nonce.d[3]._1_7_ = (undefined7)(borromean_s[local_a188].d[3] >> 8);
        borromean_s[local_a188].d[0] = 0;
        borromean_s[local_a188].d[1] = 0;
        borromean_s[local_a188].d[2] = 0;
        borromean_s[local_a188].d[3] = 0;
        s = borromean_s;
        iVar2 = secp256k1_borromean_sign
                          (&local_a170->ecmult_ctx,&local_a170->ecmult_gen_ctx,local_a178->data,s,
                           ring_pubkeys,&nonce,&blinding_key,rsizes,indices,1,msg32,0x20);
        uVar4 = (uint)(iVar2 != 0);
        if (iVar2 != 0) {
          if (uVar6 != 0) {
            bin = psVar1->data;
            do {
              bin = bin + 0x20;
              secp256k1_scalar_get_b32(bin,s);
              s = s + 1;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
            return 1;
          }
          return uVar4;
        }
        return uVar4;
      }
      return 0;
    }
    secp256k1_surjectionproof_generate_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_surjectionproof_generate(const secp256k1_context* ctx, secp256k1_surjectionproof* proof, const secp256k1_generator* ephemeral_input_tags, size_t n_ephemeral_input_tags, const secp256k1_generator* ephemeral_output_tag, size_t input_index, const unsigned char *input_blinding_key, const unsigned char *output_blinding_key) {
    secp256k1_scalar blinding_key;
    secp256k1_scalar tmps;
    secp256k1_scalar nonce;
    int overflow = 0;
    size_t rsizes[1];    /* array needed for borromean sig API */
    size_t indices[1];   /* array needed for borromean sig API */
    size_t i;
    size_t n_total_pubkeys;
    size_t n_used_pubkeys;
    size_t ring_input_index = 0;
    secp256k1_gej ring_pubkeys[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    secp256k1_scalar borromean_s[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    unsigned char msg32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(proof != NULL);
    ARG_CHECK(ephemeral_input_tags != NULL);
    ARG_CHECK(ephemeral_output_tag != NULL);
    ARG_CHECK(input_blinding_key != NULL);
    ARG_CHECK(output_blinding_key != NULL);
#ifdef VERIFY
    CHECK(proof->initialized == 1);
#endif

    /* Compute secret key */
    secp256k1_scalar_set_b32(&tmps, input_blinding_key, &overflow);
    if (overflow) {
        return 0;
    }
    secp256k1_scalar_set_b32(&blinding_key, output_blinding_key, &overflow);
    if (overflow) {
        return 0;
    }
    /* The only time the input may equal the output is if neither one was blinded in the first place,
     * i.e. both blinding keys are zero. Otherwise this is a privacy leak. */
    if (secp256k1_scalar_eq(&tmps, &blinding_key) && !secp256k1_scalar_is_zero(&blinding_key)) {
        return 0;
    }
    secp256k1_scalar_negate(&tmps, &tmps);
    secp256k1_scalar_add(&blinding_key, &blinding_key, &tmps);

    /* Compute public keys */
    n_total_pubkeys = secp256k1_surjectionproof_n_total_inputs(ctx, proof);
    n_used_pubkeys = secp256k1_surjectionproof_n_used_inputs(ctx, proof);
    if (n_used_pubkeys > n_total_pubkeys || n_total_pubkeys != n_ephemeral_input_tags) {
        return 0;
    }

    if (secp256k1_surjection_compute_public_keys(ring_pubkeys, n_used_pubkeys, ephemeral_input_tags, n_total_pubkeys, proof->used_inputs, ephemeral_output_tag, input_index, &ring_input_index) == 0) {
        return 0;
    }

    /* Produce signature */
    rsizes[0] = (int) n_used_pubkeys;
    indices[0] = (int) ring_input_index;
    secp256k1_surjection_genmessage(msg32, ephemeral_input_tags, n_total_pubkeys, ephemeral_output_tag);
    if (secp256k1_surjection_genrand(borromean_s, n_used_pubkeys, &blinding_key) == 0) {
        return 0;
    }
    /* Borromean sign will overwrite one of the s values we just generated, so use
     * it as a nonce instead. This avoids extra random generation and also is an
     * homage to the rangeproof code which does this very cleverly to encode messages. */
    nonce = borromean_s[ring_input_index];
    secp256k1_scalar_clear(&borromean_s[ring_input_index]);
    if (secp256k1_borromean_sign(&ctx->ecmult_ctx, &ctx->ecmult_gen_ctx, &proof->data[0], borromean_s, ring_pubkeys, &nonce, &blinding_key, rsizes, indices, 1, msg32, 32) == 0) {
        return 0;
    }
    for (i = 0; i < n_used_pubkeys; i++) {
        secp256k1_scalar_get_b32(&proof->data[32 + 32 * i], &borromean_s[i]);
    }
    return 1;
}